

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::addedRows(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int n)

{
  SPxId *pSVar1;
  int iVar2;
  Status SVar3;
  uint uVar4;
  undefined8 *puVar6;
  long lVar7;
  DataKey local_50;
  long local_48;
  undefined1 local_40 [16];
  DataKey local_30;
  SPxStatus SVar5;
  
  if (0 < n) {
    reDim(this);
    iVar2 = (this->theLP->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum - n;
    if (this->theLP->theRep == COLUMN) {
      lVar7 = (long)iVar2;
      do {
        SVar3 = dualRowStatus(this,(int)lVar7);
        (this->thedesc).rowstat.data[lVar7] = SVar3;
        local_30 = (this->theLP->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey[lVar7];
        SPxRowId::SPxRowId((SPxRowId *)&local_50,&local_30);
        pSVar1 = (this->theBaseId).data;
        pSVar1[lVar7].super_DataKey = local_50;
        pSVar1[lVar7].super_DataKey.info = -1;
        lVar7 = lVar7 + 1;
      } while (lVar7 < (this->theLP->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum);
    }
    else {
      lVar7 = (long)iVar2;
      do {
        SVar3 = dualRowStatus(this,(int)lVar7);
        (this->thedesc).rowstat.data[lVar7] = SVar3;
        lVar7 = lVar7 + 1;
      } while (lVar7 < (this->theLP->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum);
    }
    SVar5 = this->thestatus;
    if ((NO_PROBLEM < SVar5) && (this->matrixIsSetup == true)) {
      loadMatrixVecs(this);
      SVar5 = this->thestatus;
    }
    uVar4 = SVar5 + PRIMAL;
    if (7 < uVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ECHBAS04 Unknown basis status!",0x1e);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_50 = (DataKey)local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"XCHBAS01 This should never happen.","");
      *puVar6 = &PTR__SPxException_0069d438;
      puVar6[1] = puVar6 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar6 + 1),local_50,(undefined1 *)(local_48 + (long)local_50));
      *puVar6 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    if ((0xfU >> (uVar4 & 0x1f) & 1) == 0) {
      this->thestatus = (uint)((0x50U >> (uVar4 & 0x1f) & 1) == 0);
    }
  }
  return;
}

Assistant:

void SPxBasisBase<R>::addedRows(int n)
{
   assert(theLP != nullptr);

   if(n > 0)
   {
      reDim();

      if(theLP->rep() == SPxSolverBase<R>::COLUMN)
      {
         /* after adding rows in column representation, reDim() should set these bools to false. */
         assert(!matrixIsSetup && !factorized);

         for(int i = theLP->nRows() - n; i < theLP->nRows(); ++i)
         {
            thedesc.rowStatus(i) = dualRowStatus(i);
            baseId(i) = theLP->SPxLPBase<R>::rId(i);
         }
      }
      else
      {
         assert(theLP->rep() == SPxSolverBase<R>::ROW);

         for(int i = theLP->nRows() - n; i < theLP->nRows(); ++i)
            thedesc.rowStatus(i) = dualRowStatus(i);
      }

      /* If matrix was set up, load new basis vectors to the matrix.
       * In the row case, the basis is not effected by adding rows. However,
       * since @c matrix stores references to the rows in the LP (SPxLPBase<R>), a realloc
       * in SPxLPBase<R> (e.g. due to space requirements) might invalidate these references.
       * We therefore have to "reload" the matrix if it is set up. Note that reDim()
       * leaves @c matrixIsSetup untouched if only row have been added, since the basis
       * matrix already has the correct size. */
      if(status() > NO_PROBLEM && matrixIsSetup)
         loadMatrixVecs();

      /* update basis status */
      switch(status())
      {
      case PRIMAL:
      case UNBOUNDED:
         setStatus(REGULAR);
         break;

      case OPTIMAL:
      case INFEASIBLE:
         setStatus(DUAL);
         break;

      case NO_PROBLEM:
      case SINGULAR:
      case REGULAR:
      case DUAL:
         break;

      default:
         SPX_MSG_ERROR(std::cerr << "ECHBAS04 Unknown basis status!" << std::endl;)
         throw SPxInternalCodeException("XCHBAS01 This should never happen.");
      }
   }
}